

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O3

int floatx80_eq_quiet_mips(floatx80 a,floatx80 b,float_status *status)

{
  int iVar1;
  uint64_t uVar2;
  ushort uVar3;
  bool bVar4;
  
  uVar2 = a.low;
  uVar3 = a.high & 0x7fff;
  if ((long)uVar2 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)b.low < 0
       ) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
           uVar3 != 0x7fff) &&
         (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
          (b.high & 0x7fff) != 0x7fff)) {
        iVar1 = 0;
        if ((uVar2 == b.low) && ((iVar1 = 1, a.high != b.high && (iVar1 = 0, uVar2 == 0)))) {
          return (int)(((b._8_4_ | a._8_4_) & 0x7fff) == 0);
        }
      }
      else {
        if (status->snan_bit_is_one == '\0') {
          if (((uVar3 == 0x7fff) &&
              (((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0
              )) && (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) ==
                     (undefined1  [16])0x0)) goto LAB_00722298;
          bVar4 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                  (undefined1  [16])0x0 &&
                  ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                  (undefined1  [16])0x0;
        }
        else {
          if (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0
              && uVar3 == 0x7fff) goto LAB_00722298;
          bVar4 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) !=
                  (undefined1  [16])0x0;
        }
        iVar1 = 0;
        if (((b._8_4_ & 0x7fff) == 0x7fff) && (bVar4)) goto LAB_00722298;
      }
      return iVar1;
    }
  }
LAB_00722298:
  status->float_exception_flags = status->float_exception_flags | 1;
  return 0;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}